

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O2

int glist_selectionindex(_glist *x,t_gobj *y,int selected)

{
  t_gobj *y_00;
  int iVar1;
  int iVar2;
  t_gobj **pptVar3;
  
  iVar2 = 0;
  pptVar3 = &x->gl_list;
  while ((y_00 = *pptVar3, y_00 != (t_gobj *)0x0 && (y_00 != y))) {
    iVar1 = glist_isselected(x,y_00);
    iVar2 = iVar2 + (uint)(iVar1 == selected);
    pptVar3 = &y_00->g_next;
  }
  return iVar2;
}

Assistant:

int glist_selectionindex(t_glist *x, t_gobj *y, int selected)
{
    t_gobj *y2;
    int indx;

    for (y2 = x->gl_list, indx = 0; y2 && y2 != y; y2 = y2->g_next)
        if (selected == glist_isselected(x, y2))
            indx++;
    return (indx);
}